

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_cond.cpp
# Opt level: O2

void __thiscall SharedCond::~SharedCond(SharedCond *this)

{
  __pid_t _Var1;
  int iVar2;
  ContextManager *pCVar3;
  string local_30;
  
  _Var1 = getpid();
  if (_Var1 == this->owner_pid_) {
    iVar2 = pthread_cond_destroy
                      ((pthread_cond_t *)
                       ((this->cond_)._M_t.
                        super___uniq_ptr_impl<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_SharedMemoryObject<pthread_cond_t>_*,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
                        .super__Head_base<0UL,_SharedMemoryObject<pthread_cond_t>_*,_false>.
                       _M_head_impl)->ptr_);
    if (iVar2 != 0) {
      pCVar3 = ContextManager::get();
      format_abi_cxx11_(&local_30,"Failed to destroy cond: %m");
      (**pCVar3->_vptr_ContextManager)(pCVar3,&local_30);
      std::__cxx11::string::~string((string *)&local_30);
    }
  }
  std::
  unique_ptr<SharedMemoryObject<pthread_cond_t>,_std::default_delete<SharedMemoryObject<pthread_cond_t>_>_>
  ::~unique_ptr(&this->cond_);
  return;
}

Assistant:

SharedCond::~SharedCond() {
    if (getpid() == owner_pid_) {
        if (pthread_cond_destroy(cond_->get()) != 0) {
            die(format("Failed to destroy cond: %m"));
        }
    }
}